

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_0::Btree_map_int64_Test::TestBody(Btree_map_int64_Test *this)

{
  undefined8 uVar1;
  undefined *puVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [8];
  size_type sVar9;
  ulong uVar10;
  Generator<std::pair<const_long,_long>_> GVar11;
  mapped_type *pmVar12;
  pointer ppVar13;
  Generator<std::pair<const_long,_long>_> GVar14;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *extraout_RDX;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *extraout_RDX_00;
  undefined8 extraout_RDX_01;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *pvVar15;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *values;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  n;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_03;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_05;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  extraout_RDX_06;
  size_type n_00;
  mapped_type mVar16;
  int i;
  int iVar17;
  int in_R8D;
  char *pcVar18;
  btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
  *__tmp;
  AssertionResult AVar19;
  int64_t original_bytes1_2;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> sorted_values;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> random_values;
  int64_t original_bytes1;
  unique_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
  container;
  Generator<std::pair<const_long,_long>_> generator;
  int64_t bytes2;
  PropagatingCountingAlloc<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
  allocator2;
  PropagatingCountingAlloc<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
  allocator1;
  Generator<std::pair<const_long,_long>_> local_118;
  undefined1 local_110 [8];
  Generator<std::pair<const_long,_long>_> local_108;
  pointer local_100;
  undefined1 local_f8 [8];
  _Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
  local_f0;
  pointer ppStack_e8;
  _Base_ptr local_e0;
  pair<const_long,_long> local_d8;
  AssertHelper local_c8;
  Generator<std::pair<const_long,_long>_> local_c0;
  btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
  local_b8;
  _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  local_98;
  Generator<std::pair<const_long,_long>_> local_68;
  long local_60;
  node_type *local_58;
  pointer local_50;
  pointer local_48;
  CountingAllocator<std::pair<const_long,_long>_> local_40;
  CountingAllocator<std::pair<const_long,_long>_> local_38;
  
  local_d8.second = local_d8.first;
  (anonymous_namespace)::
  ConstTest<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>>
            ();
  GenerateValuesWithSeed<std::pair<long,long>>
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_f8,
             (priv *)0x2710,40000,testing::FLAGS_gtest_random_seed,in_R8D);
  local_b8.size_ = (size_type)&local_b8;
  local_b8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
        )&btree<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,false>>
          ::EmptyNode()::empty_node;
  local_b8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
  ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ =
       (PropagatingCountingAlloc<std::pair<const_long,_long>_>)
       &btree<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,false>>
        ::EmptyNode()::empty_node;
  local_b8.rightmost_ = (node_type *)0x0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_110,
             (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_f8);
  auVar8 = local_110;
  GVar11 = local_108;
  pvVar15 = extraout_RDX;
  if ((Generator<std::pair<const_long,_long>_>)local_110 != local_108) {
    uVar10 = (long)local_108 - (long)local_110 >> 4;
    lVar3 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<long,long>*,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_110,local_108,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<long,long>*,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (auVar8,GVar11);
    pvVar15 = extraout_RDX_00;
  }
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::unique_checker<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::map<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>,std::pair<long,long>>
            ((char *)&local_b8,
             (unique_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
              *)local_110,pvVar15);
  pvVar15 = (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
            CONCAT71((int7)((ulong)extraout_RDX_01 >> 8),
                     (Generator<std::pair<const_long,_long>_>)local_110 != local_108);
  GVar14 = (Generator<std::pair<const_long,_long>_>)((long)local_108 + -0x10);
  GVar11 = (Generator<std::pair<const_long,_long>_>)local_110;
  if ((ulong)local_110 < (ulong)GVar14 &&
      (Generator<std::pair<const_long,_long>_>)local_110 != local_108) {
    do {
      uVar1 = *(undefined8 *)GVar11;
      *(undefined8 *)GVar11 = *(undefined8 *)GVar14;
      *(undefined8 *)GVar14 = uVar1;
      pvVar15 = *(vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> **)
                 ((long)GVar11 + 8);
      *(long *)((long)GVar11 + 8) = *(long *)((long)GVar14 + 8);
      *(vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> **)((long)GVar14 + 8)
           = pvVar15;
      GVar11 = (Generator<std::pair<const_long,_long>_>)((long)GVar11 + 0x10);
      GVar14 = (Generator<std::pair<const_long,_long>_>)((long)GVar14 + -0x10);
    } while ((ulong)GVar11 < (ulong)GVar14);
  }
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::unique_checker<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::map<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>,std::pair<long,long>>
            ((char *)&local_b8,
             (unique_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
              *)local_110,pvVar15);
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::unique_checker<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::map<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>,std::pair<long,long>>
            ((char *)&local_b8,
             (unique_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
              *)local_f8,values);
  if ((Generator<std::pair<const_long,_long>_>)local_110 !=
      (Generator<std::pair<const_long,_long>_>)0x0) {
    operator_delete((void *)local_110,(long)local_100 - (long)local_110);
  }
  std::
  _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  ::~_Rb_tree(&local_98);
  btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
  ::~btree((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
            *)&local_b8);
  if (local_f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_f8,(long)ppStack_e8 - (long)local_f8);
  }
  local_60 = 0;
  local_68.tgen.maxval = 1000;
  local_68.ugen.maxval = 1000;
  local_c0.tgen.maxval = 0x20;
  local_c0.ugen.maxval = 0;
  local_40.bytes_used_ = &local_60;
  local_38.bytes_used_ = (int64_t *)&local_c0;
  local_48 = (pointer)operator_new(0x20);
  local_60 = local_60 + 0x20;
  local_50 = (pointer)operator_new(0x20);
  local_b8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
        )btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
         ::EmptyNode()::empty_node;
  local_b8.rightmost_ =
       (node_type *)
       btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
       ::EmptyNode()::empty_node;
  local_b8.size_ = 0;
  local_d8.first._0_4_ = local_c0.tgen.maxval;
  local_d8.first._4_4_ = local_c0.ugen.maxval;
  local_b8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
  ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ =
       (PropagatingCountingAlloc<std::pair<const_long,_long>_>)
       (PropagatingCountingAlloc<std::pair<const_long,_long>_>)&local_c0;
  _local_110 = Generator<std::pair<const_long,_long>_>::operator()(&local_68,0);
  btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>,_bool>
            *)local_f8,
           (btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
            *)&local_b8,(value_type *)local_110);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_f8,"bytes1","original_bytes1",(long *)&local_c0,&local_d8.first);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((CountingAllocator<std::pair<const_long,_long>_>)
        local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ ==
        (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)local_f0._M_head_impl.
                          super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2be,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_118,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_118);
    if ((Generator<std::pair<const_long,_long>_>)local_110 !=
        (Generator<std::pair<const_long,_long>_>)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((CountingAllocator<std::pair<const_long,_long>_>)
      local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ !=
      (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                 bytes_used_);
  }
  if (local_b8.size_ != 0) {
    btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
    ::internal_clear(&local_b8,
                     (node_type *)
                     local_b8.root_.
                     super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
                     ._M_head_impl);
  }
  local_b8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
        )btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
         ::EmptyNode()::empty_node;
  local_b8.rightmost_ =
       (node_type *)
       btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
       ::EmptyNode()::empty_node;
  local_b8.size_ = 0;
  auVar4._8_8_ = 0;
  auVar4._0_4_ = local_108.tgen.maxval;
  auVar4._4_4_ = local_108.ugen.maxval;
  _local_110 = (pair<const_long,_long>)(auVar4 << 0x40);
  local_118 = (Generator<std::pair<const_long,_long>_>)((ulong)(uint)local_118.ugen.maxval << 0x20);
  local_b8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
  ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ =
       (PropagatingCountingAlloc<std::pair<const_long,_long>_>)
       (PropagatingCountingAlloc<std::pair<const_long,_long>_>)&local_60;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_f8,"b1.size()","0",(unsigned_long *)local_110,(int *)&local_118);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((CountingAllocator<std::pair<const_long,_long>_>)
        local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ ==
        (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)local_f0._M_head_impl.
                          super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c2,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_118,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_118);
    if ((Generator<std::pair<const_long,_long>_>)local_110 !=
        (Generator<std::pair<const_long,_long>_>)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((CountingAllocator<std::pair<const_long,_long>_>)
      local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ !=
      (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                 bytes_used_);
  }
  auVar5._8_8_ = 0;
  auVar5._0_4_ = local_108.tgen.maxval;
  auVar5._4_4_ = local_108.ugen.maxval;
  _local_110 = (pair<const_long,_long>)(auVar5 << 0x40);
  local_118 = (Generator<std::pair<const_long,_long>_>)((ulong)local_118 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_f8,"b2.size()","0",(unsigned_long *)local_110,(int *)&local_118);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((CountingAllocator<std::pair<const_long,_long>_>)
        local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ ==
        (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)local_f0._M_head_impl.
                          super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c3,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_118,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_118);
    if ((Generator<std::pair<const_long,_long>_>)local_110 !=
        (Generator<std::pair<const_long,_long>_>)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((CountingAllocator<std::pair<const_long,_long>_>)
      local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ !=
      (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                 bytes_used_);
  }
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_f8,"bytes1","original_bytes1",(long *)&local_c0,&local_d8.first);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((CountingAllocator<std::pair<const_long,_long>_>)
        local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ ==
        (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)local_f0._M_head_impl.
                          super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c4,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_118,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_118);
    if ((Generator<std::pair<const_long,_long>_>)local_110 !=
        (Generator<std::pair<const_long,_long>_>)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((CountingAllocator<std::pair<const_long,_long>_>)
      local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ !=
      (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                 bytes_used_);
  }
  iVar17 = 1;
  do {
    _local_110 = Generator<std::pair<const_long,_long>_>::operator()(&local_68,iVar17);
    btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>,_bool>
              *)local_f8,
             (btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
              *)&local_b8,(value_type *)local_110);
    iVar17 = iVar17 + 1;
  } while (iVar17 != 1000);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_f8,"bytes2","bytes1",&local_60,(long *)&local_c0);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((CountingAllocator<std::pair<const_long,_long>_>)
        local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ ==
        (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)local_f0._M_head_impl.
                          super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2cb,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_118,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_118);
    if ((Generator<std::pair<const_long,_long>_>)local_110 !=
        (Generator<std::pair<const_long,_long>_>)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((CountingAllocator<std::pair<const_long,_long>_>)
      local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ !=
      (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                 bytes_used_);
  }
  if (local_b8.size_ != 0) {
    btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
    ::internal_clear(&local_b8,
                     (node_type *)
                     local_b8.root_.
                     super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
                     ._M_head_impl);
  }
  local_b8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
        )btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
         ::EmptyNode()::empty_node;
  local_b8.rightmost_ =
       (node_type *)
       btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
       ::EmptyNode()::empty_node;
  local_b8.size_ = 0;
  local_d8.first._0_4_ = local_c0.tgen.maxval;
  local_d8.first._4_4_ = local_c0.ugen.maxval;
  local_b8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
  ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ =
       (PropagatingCountingAlloc<std::pair<const_long,_long>_>)
       (PropagatingCountingAlloc<std::pair<const_long,_long>_>)&local_c0;
  _local_110 = Generator<std::pair<const_long,_long>_>::operator()(&local_68,0);
  btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>,_bool>
            *)local_f8,
           (btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
            *)&local_b8,(value_type *)local_110);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_f8,"bytes1","original_bytes1",(long *)&local_c0,&local_d8.first);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((CountingAllocator<std::pair<const_long,_long>_>)
        local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ ==
        (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)local_f0._M_head_impl.
                          super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2d5,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_118,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_118);
    if ((Generator<std::pair<const_long,_long>_>)local_110 !=
        (Generator<std::pair<const_long,_long>_>)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((CountingAllocator<std::pair<const_long,_long>_>)
      local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ !=
      (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                 bytes_used_);
  }
  if (local_b8.size_ != 0) {
    btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
    ::internal_clear(&local_b8,
                     (node_type *)
                     local_b8.root_.
                     super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
                     ._M_head_impl);
  }
  local_b8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
        )btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
         ::EmptyNode()::empty_node;
  local_b8.rightmost_ =
       (node_type *)
       btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
       ::EmptyNode()::empty_node;
  local_b8.size_ = 0;
  auVar6._8_8_ = 0;
  auVar6._0_4_ = local_108.tgen.maxval;
  auVar6._4_4_ = local_108.ugen.maxval;
  _local_110 = (pair<const_long,_long>)(auVar6 << 0x40);
  local_118 = (Generator<std::pair<const_long,_long>_>)((ulong)local_118 & 0xffffffff00000000);
  local_b8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
  ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ =
       (PropagatingCountingAlloc<std::pair<const_long,_long>_>)
       (PropagatingCountingAlloc<std::pair<const_long,_long>_>)&local_60;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_f8,"b1.size()","0",(unsigned_long *)local_110,(int *)&local_118);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((CountingAllocator<std::pair<const_long,_long>_>)
        local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ ==
        (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)local_f0._M_head_impl.
                          super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2d9,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_118,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_118);
    if ((Generator<std::pair<const_long,_long>_>)local_110 !=
        (Generator<std::pair<const_long,_long>_>)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((CountingAllocator<std::pair<const_long,_long>_>)
      local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ !=
      (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                 bytes_used_);
  }
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_f8,"bytes1","original_bytes1",(long *)&local_c0,&local_d8.first);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((CountingAllocator<std::pair<const_long,_long>_>)
        local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ ==
        (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)local_f0._M_head_impl.
                          super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2da,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_118,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_118);
    if ((Generator<std::pair<const_long,_long>_>)local_110 !=
        (Generator<std::pair<const_long,_long>_>)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((CountingAllocator<std::pair<const_long,_long>_>)
      local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ !=
      (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                 bytes_used_);
  }
  iVar17 = 1;
  do {
    _local_110 = Generator<std::pair<const_long,_long>_>::operator()(&local_68,iVar17);
    btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>,_bool>
              *)local_f8,
             (btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
              *)&local_b8,(value_type *)local_110);
    iVar17 = iVar17 + 1;
  } while (iVar17 != 1000);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_f8,"bytes2","bytes1",&local_60,(long *)&local_c0);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if (local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ ==
        (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)local_f0._M_head_impl.
                          super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2e1,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_118,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_118);
    if ((Generator<std::pair<const_long,_long>_>)local_110 !=
        (Generator<std::pair<const_long,_long>_>)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if (local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ !=
      (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                 bytes_used_);
  }
  if (local_b8.size_ != 0) {
    btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
    ::internal_clear(&local_b8,
                     (node_type *)
                     local_b8.root_.
                     super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
                     ._M_head_impl);
  }
  local_b8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
        )btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
         ::EmptyNode()::empty_node;
  local_b8.rightmost_ =
       (node_type *)
       btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
       ::EmptyNode()::empty_node;
  local_b8.size_ = 0;
  local_118 = local_c0;
  local_b8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
  ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ =
       (PropagatingCountingAlloc<std::pair<const_long,_long>_>)
       (PropagatingCountingAlloc<std::pair<const_long,_long>_>)&local_c0;
  local_d8 = Generator<std::pair<const_long,_long>_>::operator()(&local_68,0);
  btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>,_bool>
            *)local_110,
           (btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
            *)&local_b8,&local_d8);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_110,"bytes1","original_bytes1",(long *)&local_c0,(long *)&local_118);
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_108 == (Generator<std::pair<const_long,_long>_>)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = (char *)*(long *)local_108;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2eb,pcVar18);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if ((_Base_ptr)local_d8.first != (_Base_ptr)0x0) {
      (**(code **)(*(long *)local_d8.first + 8))();
    }
  }
  if (local_108 != (Generator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_110 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
  }
  sVar9 = local_b8.size_;
  local_58 = (node_type *)
             local_b8.root_.
             super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
             .
             super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
             .
             super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  ;
  ppStack_e8 = (pointer)local_b8.rightmost_;
  local_b8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
        )btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
         ::EmptyNode()::empty_node;
  local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ =
       local_b8.root_.
       super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
       .
       super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
       .
       super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
       ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_;
  local_f8 = (undefined1  [8])local_58;
  local_b8.rightmost_ =
       (node_type *)
       btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
       ::EmptyNode()::empty_node;
  local_b8.size_ = 0;
  local_e0 = (_Base_ptr)sVar9;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_d8.second;
  local_d8 = (pair<const_long,_long>)(auVar7 << 0x40);
  local_c8.data_._0_4_ = 0;
  local_b8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
  ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ =
       (PropagatingCountingAlloc<std::pair<const_long,_long>_>)
       (PropagatingCountingAlloc<std::pair<const_long,_long>_>)&local_60;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_110,"b1.size()","0",(unsigned_long *)&local_d8,(int *)&local_c8);
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_108 == (Generator<std::pair<const_long,_long>_>)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = (char *)*(long *)local_108;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2ef,pcVar18);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if ((_Base_ptr)local_d8.first != (_Base_ptr)0x0) {
      (**(code **)(*(long *)local_d8.first + 8))();
    }
  }
  if (local_108 != (Generator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_110 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
  }
  local_d8.first = sVar9;
  local_c8.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_110,"b2.size()","1",(unsigned_long *)&local_d8,(int *)&local_c8);
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_108 == (Generator<std::pair<const_long,_long>_>)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = (char *)*(long *)local_108;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f0,pcVar18);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if ((_Base_ptr)local_d8.first != (_Base_ptr)0x0) {
      (**(code **)(*(long *)local_d8.first + 8))();
    }
  }
  if (local_108 != (Generator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_110 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
  }
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_110,"bytes1","original_bytes1",(long *)&local_c0,(long *)&local_118);
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_108 == (Generator<std::pair<const_long,_long>_>)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = (char *)*(long *)local_108;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f1,pcVar18);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if ((_Base_ptr)local_d8.first != (_Base_ptr)0x0) {
      (**(code **)(*(long *)local_d8.first + 8))();
    }
  }
  if (local_108 != (Generator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_110 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
  }
  iVar17 = 1;
  do {
    local_d8 = Generator<std::pair<const_long,_long>_>::operator()(&local_68,iVar17);
    btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>,_bool>
              *)local_110,
             (btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
              *)&local_b8,&local_d8);
    iVar17 = iVar17 + 1;
  } while (iVar17 != 1000);
  AVar19 = testing::internal::CmpHelperGT<long,long>
                     ((internal *)local_110,"bytes2","bytes1",&local_60,(long *)&local_c0);
  n._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar19.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_108 == (Generator<std::pair<const_long,_long>_>)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = (char *)*(long *)local_108;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f8,pcVar18);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    n = extraout_RDX_02.
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl;
    if ((_Base_ptr)local_d8.first != (_Base_ptr)0x0) {
      (**(code **)(*(long *)local_d8.first + 8))();
      n._M_head_impl = extraout_RDX_03;
    }
  }
  if (local_108 != (Generator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_110 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
    n._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_04.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  if ((_Base_ptr)sVar9 != (_Base_ptr)0x0) {
    btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
    ::internal_clear((btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
                      *)local_f8,local_58);
    n._M_head_impl = extraout_RDX_05;
  }
  if (local_b8.size_ != 0) {
    btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
    ::internal_clear(&local_b8,
                     (node_type *)
                     local_b8.root_.
                     super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
                     ._M_head_impl);
    n._M_head_impl = extraout_RDX_06._M_head_impl;
  }
  CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
  ::deallocate((CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
                *)&local_38,local_48,(size_type)n._M_head_impl);
  CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
  ::deallocate((CountingAllocator<phmap::btree_map<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>_>_>
                *)&local_40,local_50,n_00);
  local_b8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
        )&btree<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,false>>
          ::EmptyNode()::empty_node;
  local_b8.root_.
  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
  ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ =
       (PropagatingCountingAlloc<std::pair<const_long,_long>_>)
       &btree<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,false>>
        ::EmptyNode()::empty_node;
  local_b8.rightmost_ = (node_type *)0x0;
  iVar17 = 0;
  do {
    local_110 = (undefined1  [8])0x3e8000003e8;
    _local_f8 = Generator<std::pair<const_long,_long>_>::operator()
                          ((Generator<std::pair<const_long,_long>_> *)local_110,iVar17);
    mVar16 = local_f8._8_8_;
    pmVar12 = btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
              ::operator[]((btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                            *)&local_b8,(key_type *)local_f8);
    *pmVar12 = mVar16;
    iVar17 = iVar17 + 1;
  } while (iVar17 != 1000);
  local_110 = (undefined1  [8])local_b8.rightmost_;
  local_d8.first._0_4_ = 1000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_f8,"b.size()","1000",(unsigned_long *)local_110,(int *)&local_d8);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((CountingAllocator<std::pair<const_long,_long>_>)
        local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ ==
        (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)local_f0._M_head_impl.
                          super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x30e,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if ((Generator<std::pair<const_long,_long>_>)local_110 !=
        (Generator<std::pair<const_long,_long>_>)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((CountingAllocator<std::pair<const_long,_long>_>)
      local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ !=
      (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                 bytes_used_);
  }
  if (((ulong)local_b8.root_.
              super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
              .
              super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
              .
              super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
              .
              super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
              ._M_head_impl & 7) == 0) {
    puVar2 = *(undefined **)
              local_b8.root_.
              super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
              .
              super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
              .
              super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
              .
              super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
              ._M_head_impl;
    if (((ulong)puVar2 & 7) == 0) {
      local_d8.first = 0x3e8000003e8;
      _local_110 = Generator<std::pair<const_long,_long>_>::operator()
                             ((Generator<std::pair<const_long,_long>_> *)&local_d8,0);
      testing::internal::CmpHelperEQ<long,long>
                ((internal *)local_f8,"b.begin()->first","Generator<value_type>(1000)(0).first",
                 (long *)(puVar2 + 0x10),(long *)local_110);
      if (local_f8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_110);
        if ((CountingAllocator<std::pair<const_long,_long>_>)
            local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_
            == (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
          pcVar18 = "";
        }
        else {
          pcVar18 = *(char **)local_f0._M_head_impl.
                              super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x313,pcVar18);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)local_110);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
        if ((Generator<std::pair<const_long,_long>_>)local_110 !=
            (Generator<std::pair<const_long,_long>_>)0x0) {
          (**(code **)(*(long *)local_110 + 8))();
        }
      }
      if ((CountingAllocator<std::pair<const_long,_long>_>)
          local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_ !=
          (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_f8 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                     bytes_used_);
      }
      if (((ulong)local_b8.root_.
                  super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                  .
                  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                  .
                  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                  .
                  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
                  ._M_head_impl & 7) != 0) goto LAB_00139ce4;
      puVar2 = *(undefined **)
                local_b8.root_.
                super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                .
                super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                .
                super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                .
                super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
                ._M_head_impl;
      if (((ulong)puVar2 & 7) == 0) {
        local_d8.first = 0x3e8000003e8;
        _local_110 = Generator<std::pair<const_long,_long>_>::operator()
                               ((Generator<std::pair<const_long,_long>_> *)&local_d8,0);
        testing::internal::CmpHelperEQ<long,long>
                  ((internal *)local_f8,"b.begin()->second","Generator<value_type>(1000)(0).second",
                   (long *)(puVar2 + 0x18),(long *)(local_110 + 8));
        if (local_f8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_110);
          if ((CountingAllocator<std::pair<const_long,_long>_>)
              local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
              bytes_used_ == (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
            pcVar18 = "";
          }
          else {
            pcVar18 = *(char **)local_f0._M_head_impl.
                                super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_d8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                     ,0x314,pcVar18);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)local_110)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
          if ((Generator<std::pair<const_long,_long>_>)local_110 !=
              (Generator<std::pair<const_long,_long>_>)0x0) {
            (**(code **)(*(long *)local_110 + 8))();
          }
        }
        if ((CountingAllocator<std::pair<const_long,_long>_>)
            local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_
            != (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_f8 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                       bytes_used_);
        }
        if (((ulong)local_b8.root_.
                    super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                    .
                    super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                    .
                    super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
                    ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_
            & 7) == 0) {
          local_108.tgen.maxval._0_1_ =
               *(undefined1 *)
                ((long)local_b8.root_.
                       super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                       .
                       super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                       .
                       super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
                       ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                       bytes_used_ + 10);
          local_110 = (undefined1  [8])
                      local_b8.root_.
                      super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                      .
                      super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                      .
                      super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
                      ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                      bytes_used_;
          local_108.tgen.maxval._1_3_ = 0;
          ppVar13 = std::
                    reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>_>
                    ::operator->((reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>_>
                                  *)local_110);
          local_c0.tgen.maxval = 1000;
          local_c0.ugen.maxval = 1000;
          local_d8 = Generator<std::pair<const_long,_long>_>::operator()(&local_c0,999);
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_f8,"b.rbegin()->first",
                     "Generator<value_type>(1000)(999).first",&ppVar13->first,&local_d8.first);
          if (local_f8[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_110);
            if ((CountingAllocator<std::pair<const_long,_long>_>)
                local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                bytes_used_ == (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
              pcVar18 = "";
            }
            else {
              pcVar18 = *(char **)local_f0._M_head_impl.
                                  super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_d8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                       ,0x315,pcVar18);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_d8,(Message *)local_110);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
            if ((Generator<std::pair<const_long,_long>_>)local_110 !=
                (Generator<std::pair<const_long,_long>_>)0x0) {
              (**(code **)(*(long *)local_110 + 8))();
            }
          }
          if ((CountingAllocator<std::pair<const_long,_long>_>)
              local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
              bytes_used_ != (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(local_f8 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>
                         .bytes_used_);
          }
          if (((ulong)local_b8.root_.
                      super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                      .
                      super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                      .
                      super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
                      ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                      bytes_used_ & 7) == 0) {
            local_108.tgen.maxval._0_1_ =
                 *(undefined1 *)
                  ((long)local_b8.root_.
                         super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                         .
                         super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                         .
                         super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
                         ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                         bytes_used_ + 10);
            local_110 = (undefined1  [8])
                        local_b8.root_.
                        super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                        .
                        super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_*>
                        .
                        super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
                        ._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                        bytes_used_;
            local_108.tgen.maxval._1_3_ = 0;
            ppVar13 = std::
                      reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>_>
                      ::operator->((reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>_>
                                    *)local_110);
            local_c0.tgen.maxval = 1000;
            local_c0.ugen.maxval = 1000;
            local_d8 = Generator<std::pair<const_long,_long>_>::operator()(&local_c0,999);
            testing::internal::CmpHelperEQ<long,long>
                      ((internal *)local_f8,"b.rbegin()->second",
                       "Generator<value_type>(1000)(999).second",&ppVar13->second,&local_d8.second);
            if (local_f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_110);
              if ((CountingAllocator<std::pair<const_long,_long>_>)
                  local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                  bytes_used_ == (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
                pcVar18 = "";
              }
              else {
                pcVar18 = *(char **)local_f0._M_head_impl.
                                    super_CountingAllocator<std::pair<const_long,_long>_>.
                                    bytes_used_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_d8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                         ,0x316,pcVar18);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_d8,(Message *)local_110);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
              if ((Generator<std::pair<const_long,_long>_>)local_110 !=
                  (Generator<std::pair<const_long,_long>_>)0x0) {
                (**(code **)(*(long *)local_110 + 8))();
              }
            }
            if ((CountingAllocator<std::pair<const_long,_long>_>)
                local_f0._M_head_impl.super_CountingAllocator<std::pair<const_long,_long>_>.
                bytes_used_ != (CountingAllocator<std::pair<const_long,_long>_>)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)(local_f8 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_f0._M_head_impl.
                           super_CountingAllocator<std::pair<const_long,_long>_>.bytes_used_);
            }
            btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
            ::~btree((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                      *)&local_b8);
            return;
          }
        }
        pcVar18 = 
        "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
        ;
        goto LAB_00139d27;
      }
    }
    pcVar18 = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
    ;
  }
  else {
LAB_00139ce4:
    pcVar18 = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
    ;
  }
LAB_00139d27:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,pcVar18);
}

Assistant:

void BtreeTest() {
        ConstTest<T>();

        using V = typename remove_pair_const<typename T::value_type>::type;
        const std::vector<V> random_values = GenerateValuesWithSeed<V>(
            test_values, 4 * test_values,
            GTEST_FLAG_GET(random_seed));

        unique_checker<T, C> container;

        // Test key insertion/deletion in sorted order.
        std::vector<V> sorted_values(random_values);
        std::sort(sorted_values.begin(), sorted_values.end());
        DoTest("sorted:    ", &container, sorted_values);

        // Test key insertion/deletion in reverse sorted order.
        std::reverse(sorted_values.begin(), sorted_values.end());
        DoTest("rsorted:   ", &container, sorted_values);

        // Test key insertion/deletion in random order.
        DoTest("random:    ", &container, random_values);
    }